

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O1

Point __thiscall MarkerIndex::get_node_position(MarkerIndex *this,Node *node)

{
  ulong uVar1;
  Node *pNVar2;
  Node *pNVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __hashtable *__h;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  Point position;
  Point local_38;
  Node *local_30;
  Point local_28;
  
  uVar1 = (this->node_position_cache)._M_h._M_bucket_count;
  uVar5 = (ulong)node % uVar1;
  p_Var6 = (this->node_position_cache)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6, (Node *)p_Var6->_M_nxt[1]._M_nxt != node)) {
    while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, (Node *)p_Var4[1]._M_nxt == node)) goto LAB_001666bd;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_001666bd:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var7->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    local_38 = node->left_extent;
    pNVar2 = node->parent;
    pNVar3 = node;
    while (pNVar2 != (Node *)0x0) {
      if (pNVar2->right == pNVar3) {
        local_38 = Point::traverse(&pNVar2->left_extent,&local_38);
      }
      pNVar3 = pNVar3->parent;
      pNVar2 = pNVar3->parent;
    }
    local_30 = node;
    local_28 = local_38;
    std::
    _Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<MarkerIndex::Node_const*const,Point>>
              ((_Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->node_position_cache);
  }
  else {
    local_38 = *(Point *)(p_Var4 + 2);
  }
  return local_38;
}

Assistant:

Point MarkerIndex::get_node_position(const Node *node) const {
  auto cache_entry = node_position_cache.find(node);
  if (cache_entry == node_position_cache.end()) {
    Point position = node->left_extent;
    const Node *current_node = node;
    while (current_node->parent) {
      if (current_node->parent->right == current_node) {
        position = current_node->parent->left_extent.traverse(position);
      }

      current_node = current_node->parent;
    }
    node_position_cache.insert({node, position});
    return position;
  } else {
    return cache_entry->second;
  }
}